

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::java::IsDefaultValueJavaDefault(FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  EnumValueDescriptor *pEVar3;
  LogMessage *other;
  byte bVar4;
  LogFinisher local_41;
  LogMessage local_40;
  
  TVar2 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4)) {
  case 1:
  case 3:
    bVar4 = *(int *)(field + 0xa0) == 0;
    break;
  case 2:
  case 4:
    bVar4 = *(long *)(field + 0xa0) == 0;
    break;
  case 5:
    bVar1 = *(double *)(field + 0xa0) == 0.0;
    goto LAB_002187fb;
  case 6:
    bVar1 = *(float *)(field + 0xa0) == 0.0;
LAB_002187fb:
    bVar4 = -bVar1 & 1;
    break;
  case 7:
    bVar4 = (byte)field[0xa0] ^ 1;
    break;
  case 8:
    pEVar3 = FieldDescriptor::default_value_enum(field);
    bVar4 = *(int *)(pEVar3 + 0x10) == 0;
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x1ff);
    other = internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
  case 9:
  case 10:
    bVar4 = 0;
  }
  return (bool)bVar4;
}

Assistant:

bool IsDefaultValueJavaDefault(const FieldDescriptor* field) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return field->default_value_int32() == 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return field->default_value_uint32() == 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return field->default_value_int64() == 0L;
    case FieldDescriptor::CPPTYPE_UINT64:
      return field->default_value_uint64() == 0L;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return field->default_value_double() == 0.0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return field->default_value_float() == 0.0;
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() == false;
    case FieldDescriptor::CPPTYPE_ENUM:
      return field->default_value_enum()->number() == 0;
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return false;

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return false;
}